

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skein.c
# Opt level: O3

int Skein_256_Final(Skein_256_Ctxt_t *ctx,u08b_t *hashVal)

{
  byte *pbVar1;
  u64b_t uVar2;
  u64b_t uVar3;
  u64b_t uVar4;
  u64b_t uVar5;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  u64b_t X [4];
  
  pbVar1 = (byte *)((long)(ctx->h).T + 0xf);
  *pbVar1 = *pbVar1 | 0x80;
  uVar7 = (ctx->h).bCnt;
  if (uVar7 < 0x20) {
    memset(ctx->b + uVar7,0,0x20 - uVar7);
    uVar7 = (ctx->h).bCnt;
  }
  Skein_256_Process_Block(ctx,ctx->b,1,uVar7);
  uVar7 = (ctx->h).hashBitLen + 7;
  ctx->b[0] = '\0';
  ctx->b[1] = '\0';
  ctx->b[2] = '\0';
  ctx->b[3] = '\0';
  ctx->b[4] = '\0';
  ctx->b[5] = '\0';
  ctx->b[6] = '\0';
  ctx->b[7] = '\0';
  ctx->b[8] = '\0';
  ctx->b[9] = '\0';
  ctx->b[10] = '\0';
  ctx->b[0xb] = '\0';
  ctx->b[0xc] = '\0';
  ctx->b[0xd] = '\0';
  ctx->b[0xe] = '\0';
  ctx->b[0xf] = '\0';
  ctx->b[0x10] = '\0';
  ctx->b[0x11] = '\0';
  ctx->b[0x12] = '\0';
  ctx->b[0x13] = '\0';
  ctx->b[0x14] = '\0';
  ctx->b[0x15] = '\0';
  ctx->b[0x16] = '\0';
  ctx->b[0x17] = '\0';
  ctx->b[0x18] = '\0';
  ctx->b[0x19] = '\0';
  ctx->b[0x1a] = '\0';
  ctx->b[0x1b] = '\0';
  ctx->b[0x1c] = '\0';
  ctx->b[0x1d] = '\0';
  ctx->b[0x1e] = '\0';
  ctx->b[0x1f] = '\0';
  uVar2 = ctx->X[2];
  uVar3 = ctx->X[3];
  uVar4 = ctx->X[0];
  uVar5 = ctx->X[1];
  if (7 < uVar7) {
    uVar7 = uVar7 >> 3;
    uVar6 = 0x20;
    if (0x20 < uVar7) {
      uVar6 = uVar7;
    }
    lVar8 = 0;
    do {
      *(long *)ctx->b = lVar8;
      (ctx->h).T[1] = 0xff00000000000000;
      (ctx->h).bCnt = 0;
      (ctx->h).T[0] = 0;
      Skein_256_Process_Block(ctx,ctx->b,1,8);
      __n = 0x20;
      if (uVar7 < 0x20) {
        __n = uVar7;
      }
      memcpy(hashVal,ctx->X,__n);
      ctx->X[0] = uVar4;
      ctx->X[1] = uVar5;
      ctx->X[2] = uVar2;
      ctx->X[3] = uVar3;
      lVar8 = lVar8 + 1;
      uVar7 = uVar7 - 0x20;
      hashVal = hashVal + 0x20;
    } while ((uVar6 - 1 >> 5) + 1 != lVar8);
  }
  return 0;
}

Assistant:

int Skein_256_Final(Skein_256_Ctxt_t *ctx, u08b_t *hashVal)
{
    size_t i,n,byteCnt;
    u64b_t X[SKEIN_256_STATE_WORDS];
    Skein_Assert(ctx->h.bCnt <= SKEIN_256_BLOCK_BYTES,SKEIN_FAIL);    /* catch uninitialized context */

    ctx->h.T[1] |= SKEIN_T1_FLAG_FINAL;                 /* tag as the final block */
    if (ctx->h.bCnt < SKEIN_256_BLOCK_BYTES)            /* zero pad b[] if necessary */
        memset(&ctx->b[ctx->h.bCnt],0,SKEIN_256_BLOCK_BYTES - ctx->h.bCnt);

    Skein_256_Process_Block(ctx,ctx->b,1,ctx->h.bCnt);  /* process the final block */

    /* now output the result */
    byteCnt = (ctx->h.hashBitLen + 7) >> 3;             /* total number of output bytes */

    /* run Threefish in "counter mode" to generate output */
    memset(ctx->b,0,sizeof(ctx->b));  /* zero out b[], so it can hold the counter */
    memcpy(X,ctx->X,sizeof(X));       /* keep a local copy of counter mode "key" */
    for (i=0;i*SKEIN_256_BLOCK_BYTES < byteCnt;i++)
    {
        ((u64b_t *)ctx->b)[0]= Skein_Swap64((u64b_t) i); /* build the counter block */
        Skein_Start_New_Type(ctx,OUT_FINAL);
        Skein_256_Process_Block(ctx,ctx->b,1,sizeof(u64b_t)); /* run "counter mode" */
        n = byteCnt - i*SKEIN_256_BLOCK_BYTES;   /* number of output bytes left to go */
        if (n >= SKEIN_256_BLOCK_BYTES)
            n  = SKEIN_256_BLOCK_BYTES;
        Skein_Put64_LSB_First(hashVal+i*SKEIN_256_BLOCK_BYTES,ctx->X,n);   /* "output" the ctr mode bytes */
        Skein_Show_Final(256,&ctx->h,n,hashVal+i*SKEIN_256_BLOCK_BYTES);
        memcpy(ctx->X,X,sizeof(X));   /* restore the counter mode key for next time */
    }
    return SKEIN_SUCCESS;
}